

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_float2 *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  bool bVar1;
  bool bVar2;
  Property *pPVar3;
  size_type sVar4;
  mapped_type *this;
  ostream *poVar5;
  Property *pPVar6;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff0d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb8 [32];
  string local_e98 [32];
  ostringstream local_e78 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0 [39];
  allocator local_ca9;
  string local_ca8 [32];
  string local_c88;
  ostringstream local_c68 [8];
  ostringstream ss_e_3;
  allocator local_ae9;
  undefined1 local_ae8 [32];
  undefined1 local_ac8 [40];
  ParseResult ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60 [39];
  allocator local_a39;
  string local_a38 [32];
  string local_a18;
  ostringstream local_9f8 [8];
  ostringstream ss_e_2;
  allocator local_879;
  undefined1 local_878 [32];
  undefined1 local_858 [40];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0 [39];
  allocator local_7c9;
  string local_7c8 [32];
  fmt local_7a8 [32];
  ostringstream local_788 [8];
  ostringstream ss_e_1;
  allocator local_609;
  undefined1 local_608 [32];
  undefined1 local_5e8 [32];
  undefined1 local_5c8 [8];
  ParseResult sret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578 [32];
  ostringstream local_558 [8];
  ostringstream ss_e;
  allocator local_3d9;
  string local_3d8;
  string local_3b8;
  undefined1 local_398 [8];
  ParseResult ret;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> tok_attr;
  key_type local_e8 [4];
  reference_conflict local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  allocator local_91;
  value_type local_90 [4];
  undefined1 local_70 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  UsdPrimvarReader_float2 *preader_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_70);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_90,"info:id",&local_91);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_70,local_90);
  ::std::__cxx11::string::~string((string *)local_90);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
  __end2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::begin(properties);
  prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
          *)::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::end(properties);
  while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
    local_c8 = ::std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
               ::operator*(&__end2);
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c8,"inputs:varname");
    tok_attr._638_1_ = 0;
    tok_attr._637_1_ = 0;
    bVar1 = false;
    if (bVar2) {
      ::std::allocator<char>::allocator();
      tok_attr._638_1_ = 1;
      ::std::__cxx11::string::string
                ((string *)local_e8,"inputs:varname",(allocator *)&tok_attr.field_0x27f);
      tok_attr._637_1_ = 1;
      sVar4 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_70,local_e8);
      bVar1 = sVar4 == 0;
    }
    if ((tok_attr._637_1_ & 1) != 0) {
      ::std::__cxx11::string::~string((string *)local_e8);
    }
    if ((tok_attr._638_1_ & 1) != 0) {
      ::std::allocator<char>::~allocator((allocator<char> *)&tok_attr.field_0x27f);
    }
    if (bVar1) {
      TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::TypedAttribute
                ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                 ((long)&ret.err.field_2 + 8));
      ::std::__cxx11::string::string((string *)&local_3b8,(string *)local_c8);
      pPVar6 = &local_c8->second;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_3d8,"inputs:varname",&local_3d9);
      anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                ((ParseResult *)local_398,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_3b8,pPVar6,&local_3d8,
                 (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                 ((long)&ret.err.field_2 + 8));
      ::std::__cxx11::string::~string((string *)&local_3d8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
      ::std::__cxx11::string::~string((string *)&local_3b8);
      if (local_398._0_4_ == Success) {
        bVar1 = ConvertTokenAttributeToStringAttribute
                          ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                           ((long)&ret.err.field_2 + 8),&preader->varname);
        if (bVar1) {
          sret.err.field_2._12_4_ = 3;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_558);
          poVar5 = ::std::operator<<((ostream *)local_558,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1086);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_558,
                                     "Failed to convert inputs:varname token type to string type.");
          ::std::operator<<(poVar5,"\n");
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_578,local_598);
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_578);
            ::std::__cxx11::string::~string((string *)local_578);
            ::std::__cxx11::string::~string((string *)local_598);
          }
          spec_local._7_1_ = 0;
          sret.err.field_2._12_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_558);
        }
      }
      else {
        if (local_398._0_4_ == TypeMismatch) {
          ::std::__cxx11::string::string((string *)local_5e8,(string *)local_c8);
          pPVar6 = &local_c8->second;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_608,"inputs:varname",&local_609);
          (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                    ((ParseResult *)local_5c8,(_anonymous_namespace_ *)local_70,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_5e8,(string *)pPVar6,(Property *)local_608,(string *)&preader->varname
                     ,in_stack_fffffffffffff0d8);
          ::std::__cxx11::string::~string((string *)local_608);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_609);
          ::std::__cxx11::string::~string((string *)local_5e8);
          if (local_5c8._0_4_ == Success) {
            sret.err.field_2._12_4_ = 3;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_788);
            poVar5 = ::std::operator<<((ostream *)local_788,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1098);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_7c8,"Faied to parse inputs:varname: {}",&local_7c9)
            ;
            fmt::format<std::__cxx11::string>
                      (local_7a8,(string *)local_7c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sret);
            poVar5 = ::std::operator<<((ostream *)local_788,(string *)local_7a8);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)local_7a8);
            ::std::__cxx11::string::~string(local_7c8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
            if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_7f0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (ret_1.err.field_2._M_local_buf + 8));
              ::std::__cxx11::string::operator=
                        ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (string *)local_7f0);
              ::std::__cxx11::string::~string((string *)local_7f0);
              ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
            }
            spec_local._7_1_ = 0;
            sret.err.field_2._12_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_788);
          }
          anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_5c8);
          if (sret.err.field_2._12_4_ != 0) goto LAB_002c19ae;
        }
        sret.err.field_2._12_4_ = 0;
      }
LAB_002c19ae:
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_398);
      TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::~TypedAttribute
                ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                 ((long)&ret.err.field_2 + 8));
      if (sret.err.field_2._12_4_ == 0) goto LAB_002c19ee;
joined_r0x002c19e1:
      if (sret.err.field_2._12_4_ != 3) goto LAB_002c20d4;
    }
    else {
LAB_002c19ee:
      ::std::__cxx11::string::string((string *)local_858,(string *)local_c8);
      pPVar3 = &local_c8->second;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_878,"inputs:fallback",&local_879);
      pPVar6 = (Property *)local_878;
      (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
                ((ParseResult *)(local_858 + 0x20),(_anonymous_namespace_ *)local_70,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_858,(string *)pPVar3,pPVar6,(string *)&preader->fallback,
                 (TypedAttribute<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                 in_stack_fffffffffffff0d8);
      ::std::__cxx11::string::~string((string *)local_878);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_879);
      ::std::__cxx11::string::~string((string *)local_858);
      if ((local_858._32_4_ == 0) || (local_858._32_4_ == 2)) {
        sret.err.field_2._12_4_ = 3;
      }
      else if (local_858._32_4_ == 1) {
        sret.err.field_2._12_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_9f8);
        poVar5 = ::std::operator<<((ostream *)local_9f8,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x109e);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_a38,"Parsing attribute `{}` failed. Error: {}",&local_a39);
        fmt::format<char[16],std::__cxx11::string>
                  (&local_a18,(fmt *)local_a38,(string *)"inputs:fallback",(char (*) [16])&ret_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar6);
        poVar5 = ::std::operator<<((ostream *)local_9f8,(string *)&local_a18);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_a18);
        ::std::__cxx11::string::~string(local_a38);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a39);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_a60,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_2.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_a60);
          ::std::__cxx11::string::~string((string *)local_a60);
          ::std::__cxx11::string::~string((string *)(ret_2.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        sret.err.field_2._12_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_9f8);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_858 + 0x20));
      if (sret.err.field_2._12_4_ != 0) goto joined_r0x002c19e1;
      ::std::__cxx11::string::string((string *)local_ac8,(string *)local_c8);
      pPVar3 = &local_c8->second;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_ae8,"outputs:result",&local_ae9);
      pPVar6 = (Property *)local_ae8;
      (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,2ul>>
                ((ParseResult *)(local_ac8 + 0x20),(_anonymous_namespace_ *)local_70,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_ac8,(string *)pPVar3,pPVar6,(string *)&preader->result,
                 (TypedTerminalAttribute<std::array<float,_2UL>_> *)in_stack_fffffffffffff0d8);
      ::std::__cxx11::string::~string((string *)local_ae8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
      ::std::__cxx11::string::~string((string *)local_ac8);
      if ((local_ac8._32_4_ == 0) || (local_ac8._32_4_ == 2)) {
        sret.err.field_2._12_4_ = 3;
      }
      else if (local_ac8._32_4_ == 1) {
        sret.err.field_2._12_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_c68);
        poVar5 = ::std::operator<<((ostream *)local_c68,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x10a0);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_ca8,"Parsing shader output property `{}` failed. Error: {}",&local_ca9);
        fmt::format<char[15],std::__cxx11::string>
                  (&local_c88,(fmt *)local_ca8,(string *)"outputs:result",(char (*) [15])&ret_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar6);
        poVar5 = ::std::operator<<((ostream *)local_c68,(string *)&local_c88);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_c88);
        ::std::__cxx11::string::~string(local_ca8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_cd0,local_cf0);
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_cd0);
          ::std::__cxx11::string::~string((string *)local_cd0);
          ::std::__cxx11::string::~string((string *)local_cf0);
        }
        spec_local._7_1_ = 0;
        sret.err.field_2._12_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_c68);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_ac8 + 0x20));
      if (sret.err.field_2._12_4_ != 0) goto joined_r0x002c19e1;
      sVar4 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_70,(key_type *)local_c8);
      if (sVar4 == 0) {
        pPVar6 = &local_c8->second;
        this = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](&(preader->super_ShaderNode).super_UsdShadePrim.props,
                            (key_type *)local_c8);
        Property::operator=(this,pPVar6);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_c8->first);
      }
      sVar4 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_70,(key_type *)local_c8);
      if (sVar4 == 0) {
        ::std::__cxx11::ostringstream::ostringstream(local_e78);
        poVar5 = ::std::operator<<((ostream *)local_e78,"[warn]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x10a2);
        ::std::operator<<(poVar5," ");
        ::std::operator+((char *)local_e98,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Unsupported/unimplemented property: ");
        poVar5 = ::std::operator<<((ostream *)local_e78,local_e98);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string(local_e98);
        if (warn != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_eb8,local_ed8);
          ::std::__cxx11::string::operator=((string *)warn,(string *)local_eb8);
          ::std::__cxx11::string::~string((string *)local_eb8);
          ::std::__cxx11::string::~string((string *)local_ed8);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_e78);
      }
    }
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
    ::operator++(&__end2);
  }
  spec_local._7_1_ = 1;
  sret.err.field_2._12_4_ = 1;
LAB_002c20d4:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_70);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_float2>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_float2 *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    DCOUT("Primreader_float2 prop = " << prop.first);
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_float2,
                   preader->fallback)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_float2, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float2, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}